

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O1

int Pdr_ManGeneralize(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,Pdr_Set_t **ppCubeMin)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Pdr_Set_t *pCube_00;
  int *piVar5;
  long lVar6;
  long lVar7;
  Pdr_Set_t *pCube_01;
  timespec ts;
  timespec local_50;
  long local_40;
  Pdr_Set_t **local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  *ppCubeMin = (Pdr_Set_t *)0x0;
  iVar3 = Pdr_ManCheckCube(p,k,pCube,ppPred,p->pPars->nConfLimit);
  if (iVar3 != -1) {
    if (iVar3 == 0) {
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->tGeneral = p->tGeneral + lVar7 + lVar6;
      iVar3 = 0;
    }
    else {
      local_38 = ppCubeMin;
      pCube_00 = Pdr_ManReduceClause(p,k,pCube);
      if (pCube_00 == (Pdr_Set_t *)0x0) {
        pCube_00 = Pdr_SetDup(pCube);
      }
      local_40 = lVar6;
      if (p->pPars->fSkipGeneral == 0) {
        piVar5 = Pdr_ManSortByPriority(p,pCube_00);
        if (0 < pCube_00->nLits) {
          iVar3 = 0;
          pCube_01 = pCube_00;
          do {
            lVar6 = (long)iVar3;
            iVar1 = piVar5[lVar6];
            lVar7 = (long)iVar1;
            if (*(int *)(&pCube_01->field_0x14 + lVar7 * 4) == -1) {
              __assert_fail("pCubeMin->Lits[i] != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                            ,0x154,
                            "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                           );
            }
            iVar4 = Pdr_SetIsInit(pCube_01,iVar1);
            pCube_00 = pCube_01;
            if (iVar4 == 0) {
              uVar2 = *(undefined4 *)(&pCube_01->field_0x14 + lVar7 * 4);
              *(undefined4 *)(&pCube_01->field_0x14 + lVar7 * 4) = 0xffffffff;
              iVar4 = Pdr_ManCheckCube(p,k,pCube_01,(Pdr_Set_t **)0x0,p->pPars->nConfLimit);
              if (iVar4 == -1) goto LAB_0054a9b4;
              *(undefined4 *)(&pCube_01->field_0x14 + lVar7 * 4) = uVar2;
              if (iVar4 != 0) {
                if (iVar3 < pCube_01->nLits + -1) {
                  do {
                    piVar5[lVar6] = piVar5[lVar6 + 1];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 < (long)pCube_01->nLits + -1);
                }
                pCube_00 = Pdr_SetCreateFrom(pCube_01,iVar1);
                Pdr_SetDeref(pCube_01);
                if (pCube_00->nLits < 1) {
                  __assert_fail("pCubeMin->nLits > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                                ,0x16b,
                                "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                               );
                }
                iVar3 = iVar3 + -1;
                piVar5 = Pdr_ManSortByPriority(p,pCube_00);
              }
            }
            iVar3 = iVar3 + 1;
            pCube_01 = pCube_00;
          } while (iVar3 < pCube_00->nLits);
        }
        if ((p->pPars->fTwoRounds != 0) && (0 < pCube_00->nLits)) {
          iVar3 = 0;
          pCube_01 = pCube_00;
          do {
            lVar6 = (long)iVar3;
            iVar1 = piVar5[lVar6];
            lVar7 = (long)iVar1;
            if (*(int *)(&pCube_01->field_0x14 + lVar7 * 4) == -1) {
              __assert_fail("pCubeMin->Lits[i] != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                            ,0x17a,
                            "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                           );
            }
            iVar4 = Pdr_SetIsInit(pCube_01,iVar1);
            pCube_00 = pCube_01;
            if (iVar4 == 0) {
              uVar2 = *(undefined4 *)(&pCube_01->field_0x14 + lVar7 * 4);
              *(undefined4 *)(&pCube_01->field_0x14 + lVar7 * 4) = 0xffffffff;
              iVar4 = Pdr_ManCheckCube(p,k,pCube_01,(Pdr_Set_t **)0x0,p->pPars->nConfLimit);
              if (iVar4 == -1) {
LAB_0054a9b4:
                Pdr_SetDeref(pCube_01);
                return -1;
              }
              *(undefined4 *)(&pCube_01->field_0x14 + lVar7 * 4) = uVar2;
              if (iVar4 != 0) {
                if (iVar3 < pCube_01->nLits + -1) {
                  do {
                    piVar5[lVar6] = piVar5[lVar6 + 1];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 < (long)pCube_01->nLits + -1);
                }
                pCube_00 = Pdr_SetCreateFrom(pCube_01,iVar1);
                Pdr_SetDeref(pCube_01);
                if (pCube_00->nLits < 1) {
                  __assert_fail("pCubeMin->nLits > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                                ,0x191,
                                "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                               );
                }
                iVar3 = iVar3 + -1;
                piVar5 = Pdr_ManSortByPriority(p,pCube_00);
              }
            }
            iVar3 = iVar3 + 1;
            pCube_01 = pCube_00;
          } while (iVar3 < pCube_00->nLits);
        }
      }
      *local_38 = pCube_00;
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->tGeneral = p->tGeneral + lVar6 + local_40;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int Pdr_ManGeneralize( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, Pdr_Set_t ** ppCubeMin )
{
    Pdr_Set_t * pCubeMin, * pCubeTmp = NULL;
    int i, j, n, Lit, RetValue;
    abctime clk = Abc_Clock();
    int * pOrder;
    // if there is no induction, return
    *ppCubeMin = NULL;
    RetValue = Pdr_ManCheckCube( p, k, pCube, ppPred, p->pPars->nConfLimit );
    if ( RetValue == -1 )
        return -1;
    if ( RetValue == 0 )
    {
        p->tGeneral += Abc_Clock() - clk;
        return 0;
    }

    // reduce clause using assumptions
//    pCubeMin = Pdr_SetDup( pCube );
    pCubeMin = Pdr_ManReduceClause( p, k, pCube );
    if ( pCubeMin == NULL )
        pCubeMin = Pdr_SetDup( pCube );

    // perform generalization
    if ( !p->pPars->fSkipGeneral )
    {
        // sort literals by their occurences
        pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        // try removing literals
        for ( j = 0; j < pCubeMin->nLits; j++ )
        {
            // use ordering
    //        i = j;
            i = pOrder[j];

            // check init state
            assert( pCubeMin->Lits[i] != -1 );
            if ( Pdr_SetIsInit(pCubeMin, i) )
                continue;
            // try removing this literal
            Lit = pCubeMin->Lits[i]; pCubeMin->Lits[i] = -1;
            RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, p->pPars->nConfLimit );
            if ( RetValue == -1 )
            {
                Pdr_SetDeref( pCubeMin );
                return -1;
            }
            pCubeMin->Lits[i] = Lit;
            if ( RetValue == 0 )
                continue;

            // remove j-th entry
            for ( n = j; n < pCubeMin->nLits-1; n++ )
                pOrder[n] = pOrder[n+1];
            j--;

            // success - update the cube
            pCubeMin = Pdr_SetCreateFrom( pCubeTmp = pCubeMin, i );
            Pdr_SetDeref( pCubeTmp );
            assert( pCubeMin->nLits > 0 );
            i--;

            // get the ordering by decreasing priorit
            pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        }

        if ( p->pPars->fTwoRounds )
        for ( j = 0; j < pCubeMin->nLits; j++ )
        {
            // use ordering
    //        i = j;
            i = pOrder[j];

            // check init state
            assert( pCubeMin->Lits[i] != -1 );
            if ( Pdr_SetIsInit(pCubeMin, i) )
                continue;
            // try removing this literal
            Lit = pCubeMin->Lits[i]; pCubeMin->Lits[i] = -1;
            RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, p->pPars->nConfLimit );
            if ( RetValue == -1 )
            {
                Pdr_SetDeref( pCubeMin );
                return -1;
            }
            pCubeMin->Lits[i] = Lit;
            if ( RetValue == 0 )
                continue;

            // remove j-th entry
            for ( n = j; n < pCubeMin->nLits-1; n++ )
                pOrder[n] = pOrder[n+1];
            j--;

            // success - update the cube
            pCubeMin = Pdr_SetCreateFrom( pCubeTmp = pCubeMin, i );
            Pdr_SetDeref( pCubeTmp );
            assert( pCubeMin->nLits > 0 );
            i--;

            // get the ordering by decreasing priorit
            pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        }
    }

    assert( ppCubeMin != NULL );
    *ppCubeMin = pCubeMin;
    p->tGeneral += Abc_Clock() - clk;
    return 1;
}